

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  undefined1 *puVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  CookieInfo *c;
  bool bVar5;
  
  c = inc;
  if (inc == (CookieInfo *)0x0) {
    c = (CookieInfo *)(*Curl_ccalloc)(1,0x820);
    if (c != (CookieInfo *)0x0) {
      pcVar3 = "none";
      if (file != (char *)0x0) {
        pcVar3 = file;
      }
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      c->filename = pcVar3;
      if (pcVar3 != (char *)0x0) goto LAB_0010db00;
      bVar5 = true;
      __stream = (FILE *)0x0;
LAB_0010dc7d:
      (*Curl_cfree)((void *)0x0);
      if (inc == (CookieInfo *)0x0) {
        Curl_cookie_cleanup(c);
      }
      if (__stream != (FILE *)0x0 && bVar5) {
        fclose(__stream);
      }
    }
    c = (CookieInfo *)0x0;
  }
  else {
LAB_0010db00:
    c->running = false;
    if ((file == (char *)0x0) || (*file == '\0')) {
      c->newsession = newsession;
    }
    else {
      if ((*file == '-') && (file[1] == '\0')) {
        bVar5 = false;
        __stream = _stdin;
      }
      else {
        __stream = fopen64(file,"r");
        bVar5 = true;
      }
      c->newsession = newsession;
      if (__stream != (FILE *)0x0) {
        pcVar3 = (char *)(*Curl_cmalloc)(5000);
        if (pcVar3 == (char *)0x0) goto LAB_0010dc7d;
        while (pcVar4 = Curl_get_line(pcVar3,5000,(FILE *)__stream), pcVar4 != (char *)0x0) {
          iVar2 = curl_strnequal("Set-Cookie:",pcVar3,0xb);
          pcVar4 = pcVar3;
          if (iVar2 != 0) {
            pcVar4 = pcVar3 + 0xb;
          }
          for (; (*pcVar4 == ' ' || (*pcVar4 == '\t')); pcVar4 = pcVar4 + 1) {
          }
          Curl_cookie_add(data,c,iVar2 != 0,true,pcVar4,(char *)0x0,(char *)0x0,true);
        }
        (*Curl_cfree)(pcVar3);
        remove_expired(c);
        if (bVar5) {
          fclose(__stream);
        }
      }
    }
    c->running = true;
    if (data != (Curl_easy *)0x0) {
      puVar1 = &(data->state).field_0x515;
      *puVar1 = *puVar1 | 0x40;
    }
  }
  return c;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile = TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile = FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(Curl_get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr = &line[11];
        headerline = TRUE;
      }
      else {
        lineptr = line;
        headerline = FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, TRUE, lineptr, NULL, NULL, TRUE);
    }
    free(line); /* free the line buffer */
    remove_expired(c); /* run this once, not on every cookie */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */
  if(data)
    data->state.cookie_engine = TRUE;

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}